

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O0

int Curl_str_cspn(char **linep,Curl_str *out,char *reject)

{
  char *__s;
  size_t sVar1;
  size_t len;
  char *s;
  char *reject_local;
  Curl_str *out_local;
  char **linep_local;
  
  __s = *linep;
  sVar1 = strcspn(__s,reject);
  if (sVar1 == 0) {
    Curl_str_init(out);
    linep_local._4_4_ = 2;
  }
  else {
    out->str = __s;
    out->len = sVar1;
    *linep = __s + sVar1;
    linep_local._4_4_ = 0;
  }
  return linep_local._4_4_;
}

Assistant:

int Curl_str_cspn(const char **linep, struct Curl_str *out, const char *reject)
{
  const char *s = *linep;
  size_t len;
  DEBUGASSERT(linep && *linep);

  len = strcspn(s, reject);
  if(len) {
    out->str = s;
    out->len = len;
    *linep = &s[len];
    return STRE_OK;
  }
  Curl_str_init(out);
  return STRE_SHORT;
}